

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int64_t test_memory_compare_value(void *memory,uint8_t value,uint64_t size)

{
  uint64_t uVar1;
  
  if (size != 0) {
    uVar1 = 0;
    do {
      if (*(byte *)((long)memory + uVar1) != value) {
        return (ulong)*(byte *)((long)memory + uVar1) - (ulong)value;
      }
      uVar1 = uVar1 + 1;
    } while (size != uVar1);
  }
  return 0;
}

Assistant:

int64_t test_memory_compare_value(const void *memory,
                                  uint8_t value,
                                  uint64_t size)
{
  for (uint64_t i = 0; i < size; ++i)
  {
    uint8_t byte = (static_cast<const uint8_t *>(memory))[i];
    if (byte != value)
    {
      return byte - value;
    }
  }
  return 0;
}